

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O1

void idx2::DecompressChunk(bitstream *ChunkStream,chunk_cache *ChunkCache,u64 ChunkAddress,int L)

{
  int iVar1;
  u64 *puVar2;
  byte *pbVar3;
  long *plVar4;
  byte *pbVar5;
  byte *pbVar6;
  i64 iVar7;
  allocator *paVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  unsigned_long uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  u32 V;
  ulong uVar19;
  ulong uVar20;
  u64 uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int local_38;
  
  puVar2 = (u64 *)(ChunkStream->Stream).Data;
  ChunkStream->BitPtr = (byte *)puVar2;
  bVar14 = 0;
  ChunkStream->BitPos = 0;
  ChunkStream->BitBuf = 0;
  ChunkStream->BitBuf = *puVar2;
  ChunkStream->BitPos = 0;
  uVar12 = bitstream::Masks.Arr[1];
  uVar13 = 0;
  uVar22 = 0;
  do {
    if (0x39 < (int)uVar13) {
      pbVar3 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar3 + (uVar13 >> 3);
      ChunkStream->BitBuf = *(u64 *)(pbVar3 + (uVar13 >> 3));
      uVar13 = uVar13 & 7;
    }
    uVar19 = ChunkStream->BitBuf >> ((byte)uVar13 & 0x3f) & bitstream::Masks.Arr[7];
    uVar18 = uVar13 + 7;
    if (0x38 < (int)uVar13) {
      pbVar3 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar3 + (uVar18 >> 3);
      ChunkStream->BitBuf = *(u64 *)(pbVar3 + (uVar18 >> 3));
      uVar18 = uVar18 & 7;
    }
    uVar22 = uVar22 + (uVar19 << (bVar14 & 0x3f));
    uVar13 = uVar18 + 1;
    bVar14 = bVar14 + 7;
  } while ((ChunkStream->BitBuf >> ((byte)uVar18 & 0x3f) & uVar12) != 0);
  ChunkStream->BitPos = uVar13;
  bVar14 = 0;
  lVar17 = 0;
  do {
    if (0x39 < (int)uVar13) {
      pbVar3 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar3 + (uVar13 >> 3);
      ChunkStream->BitBuf = *(u64 *)(pbVar3 + (uVar13 >> 3));
      uVar13 = uVar13 & 7;
    }
    uVar19 = ChunkStream->BitBuf >> ((byte)uVar13 & 0x3f) & bitstream::Masks.Arr[7];
    uVar18 = uVar13 + 7;
    if (0x38 < (int)uVar13) {
      pbVar3 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar3 + (uVar18 >> 3);
      ChunkStream->BitBuf = *(u64 *)(pbVar3 + (uVar18 >> 3));
      uVar18 = uVar18 & 7;
    }
    lVar17 = lVar17 + (uVar19 << (bVar14 & 0x3f));
    uVar13 = uVar18 + 1;
    bVar14 = bVar14 + 7;
  } while ((ChunkStream->BitBuf >> ((byte)uVar18 & 0x3f) & uVar12) != 0);
  ChunkStream->BitPos = uVar13;
  iVar15 = (int)uVar22;
  Resize<unsigned_long>(&ChunkCache->Bricks,(long)iVar15);
  plVar4 = (long *)(ChunkCache->Bricks).Buffer.Data;
  *plVar4 = lVar17;
  if (iVar15 != 1) {
    uVar13 = ChunkStream->BitPos;
    uVar19 = 1;
    do {
      uVar12 = bitstream::Masks.Arr[1];
      uVar21 = ChunkStream->BitBuf;
      uVar20 = 0;
      do {
        if (0x3f < (int)uVar13) {
          pbVar3 = ChunkStream->BitPtr;
          ChunkStream->BitPtr = pbVar3 + (uVar13 >> 3);
          uVar21 = *(u64 *)(pbVar3 + (uVar13 >> 3));
          ChunkStream->BitBuf = uVar21;
          uVar13 = uVar13 & 7;
        }
        bVar14 = (byte)uVar13;
        uVar13 = uVar13 + 1;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while ((uVar21 >> (bVar14 & 0x3f) & uVar12) == 0);
      lVar17 = lVar17 + uVar20;
      plVar4[uVar19] = lVar17;
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar22 & 0xffffffff));
    ChunkStream->BitPos = uVar13;
  }
  Resize<int>(&ChunkCache->BrickOffsets,(long)iVar15);
  pbVar3 = (ChunkStream->Stream).Data;
  pbVar5 = ChunkStream->BitPtr;
  iVar15 = ChunkStream->BitPos + 7 >> 3;
  ChunkStream->BitPtr = pbVar5 + iVar15;
  ChunkStream->BitBuf = *(u64 *)(pbVar5 + iVar15);
  iVar15 = 0;
  ChunkStream->BitPos = 0;
  pbVar5 = (ChunkCache->BrickOffsets).Buffer.Data;
  pbVar5[0] = '\0';
  uVar12 = bitstream::Masks.Arr[1];
  pbVar5[1] = '\0';
  pbVar5[2] = '\0';
  pbVar5[3] = '\0';
  lVar17 = (ChunkCache->BrickOffsets).Size;
  if (lVar17 != 1) {
    lVar24 = 1;
    do {
      uVar13 = ChunkStream->BitPos;
      bVar14 = 0;
      lVar23 = 0;
      do {
        if (0x39 < (int)uVar13) {
          pbVar6 = ChunkStream->BitPtr;
          ChunkStream->BitPtr = pbVar6 + (uVar13 >> 3);
          ChunkStream->BitBuf = *(u64 *)(pbVar6 + (uVar13 >> 3));
          uVar13 = uVar13 & 7;
        }
        uVar22 = ChunkStream->BitBuf >> ((byte)uVar13 & 0x3f) & bitstream::Masks.Arr[7];
        uVar18 = uVar13 + 7;
        if (0x38 < (int)uVar13) {
          pbVar6 = ChunkStream->BitPtr;
          ChunkStream->BitPtr = pbVar6 + (uVar18 >> 3);
          ChunkStream->BitBuf = *(u64 *)(pbVar6 + (uVar18 >> 3));
          uVar18 = uVar18 & 7;
        }
        lVar23 = lVar23 + (uVar22 << (bVar14 & 0x3f));
        uVar13 = uVar18 + 1;
        bVar14 = bVar14 + 7;
      } while ((ChunkStream->BitBuf >> ((byte)uVar18 & 0x3f) & uVar12) != 0);
      ChunkStream->BitPos = uVar13;
      iVar15 = iVar15 + (int)lVar23;
      *(int *)(pbVar5 + lVar24 * 4) = iVar15;
      lVar24 = lVar24 + 1;
    } while (lVar17 != lVar24);
  }
  uVar12 = bitstream::Masks.Arr[1];
  uVar13 = ChunkStream->BitPos;
  uVar22 = ChunkStream->BitBuf;
  do {
    if (0x39 < (int)uVar13) {
      pbVar6 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar6 + (uVar13 >> 3);
      uVar22 = *(ulong *)(pbVar6 + (uVar13 >> 3));
      ChunkStream->BitBuf = uVar22;
      uVar13 = uVar13 & 7;
    }
    uVar18 = uVar13 + 7;
    if (0x38 < (int)uVar13) {
      pbVar6 = ChunkStream->BitPtr;
      ChunkStream->BitPtr = pbVar6 + (uVar18 >> 3);
      uVar22 = *(ulong *)(pbVar6 + (uVar18 >> 3));
      ChunkStream->BitBuf = uVar22;
      uVar18 = uVar18 & 7;
    }
    uVar13 = uVar18 + 1;
  } while ((uVar22 >> ((byte)uVar18 & 0x3f) & uVar12) != 0);
  ChunkStream->BitPos = uVar13;
  if (lVar17 != 0) {
    iVar15 = *(int *)&ChunkStream->BitPtr;
    local_38 = (int)pbVar3;
    lVar24 = 0;
    do {
      iVar1 = ChunkStream->BitPos + 7;
      iVar16 = ChunkStream->BitPos + 0xe;
      if (-1 < iVar1) {
        iVar16 = iVar1;
      }
      *(int *)(pbVar5 + lVar24) = *(int *)(pbVar5 + lVar24) + (iVar15 - local_38) + (iVar16 >> 3);
      lVar24 = lVar24 + 4;
    } while (lVar17 << 2 != lVar24);
  }
  pbVar3 = (ChunkStream->Stream).Data;
  iVar7 = (ChunkStream->Stream).Bytes;
  paVar8 = (ChunkStream->Stream).Alloc;
  pbVar5 = ChunkStream->BitPtr;
  uVar9 = *(undefined8 *)((long)&(ChunkStream->Stream).Alloc + 4);
  uVar10 = *(undefined8 *)((long)&ChunkStream->BitPtr + 4);
  uVar11 = *(undefined8 *)((long)&ChunkStream->BitBuf + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Bytes + 4) =
       *(undefined8 *)((long)&(ChunkStream->Stream).Bytes + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Alloc + 4) = uVar9;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitPtr + 4) = uVar10;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitBuf + 4) = uVar11;
  (ChunkCache->ChunkStream).Stream.Data = pbVar3;
  (ChunkCache->ChunkStream).Stream.Bytes = iVar7;
  (ChunkCache->ChunkStream).Stream.Alloc = paVar8;
  (ChunkCache->ChunkStream).BitPtr = pbVar5;
  return;
}

Assistant:

void
DecompressChunk(bitstream* ChunkStream, chunk_cache* ChunkCache, u64 ChunkAddress, int L)
{
  (void)L;
  u64 Brk = ((ChunkAddress >> 18) & 0x3FFFFFFFFFFull);
  (void)Brk;
  InitRead(ChunkStream, ChunkStream->Stream);
  int NBricks = (int)ReadVarByte(ChunkStream);
  idx2_Assert(NBricks > 0);

  /* decompress and store the brick ids */
  u64 Brick = ReadVarByte(ChunkStream);
  Resize(&ChunkCache->Bricks, NBricks);
  ChunkCache->Bricks[0] = Brick;
  idx2_For (int, I, 1, NBricks)
  {
    Brick += ReadUnary(ChunkStream) + 1;
    ChunkCache->Bricks[I] = Brick;
    idx2_Assert(Brk == (Brick >> L));
  }

  Resize(&ChunkCache->BrickOffsets, NBricks);
  /* decompress and store the brick sizes */
  i32 BrickSize = 0;
  SeekToNextByte(ChunkStream);
  ChunkCache->BrickOffsets[0] = 0;
  idx2_For (int, I, 1, Size(ChunkCache->BrickOffsets))
  {
    ChunkCache->BrickOffsets[I] = (BrickSize += (i32)ReadVarByte(ChunkStream));
  }
  ReadVarByte(ChunkStream); // the size of the last brick (ignored here)
  idx2_ForEach (BrickSzIt, ChunkCache->BrickOffsets)
    *BrickSzIt += (i32)Size(*ChunkStream);
  ChunkCache->ChunkStream = *ChunkStream;
}